

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O1

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,CreateStatement *stmt)

{
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this_00;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *this_01;
  pointer *ppCVar1;
  byte bVar2;
  SchemaCatalogEntry *schema;
  ClientContext *pCVar3;
  TableCatalogEntry *pTVar4;
  pointer pVVar5;
  pointer pcVar6;
  size_type sVar7;
  ColumnBinding binding;
  CatalogTransaction transaction_00;
  undefined8 uVar8;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> oVar9;
  bool bVar10;
  int iVar11;
  pointer pCVar12;
  StatementProperties *this_02;
  pointer pBVar13;
  tuple<duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_> this_03;
  pointer pLVar14;
  Catalog *pCVar15;
  pointer pEVar16;
  type pEVar17;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_04;
  pointer pBVar18;
  BoundBaseTableRef *pBVar19;
  type statement;
  reference pvVar20;
  pointer pLVar21;
  reference pvVar22;
  BoundColumnRefExpression *this_05;
  idx_t table_index;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer this_06;
  CreateViewInfo *base;
  type pCVar24;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> oVar25;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var26;
  string *psVar27;
  vector<duckdb::Value,_true> *pvVar28;
  SecretManager *this_07;
  InvalidInputException *pIVar29;
  InternalException *this_08;
  BinderException *pBVar30;
  Value *item;
  __node_base _Var31;
  pointer pVVar32;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var33;
  long *plVar34;
  size_type *this_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> bound_provider;
  type root;
  templated_unique_single_t create_table;
  CreateSecretInput create_secret_input;
  CatalogTransaction transaction;
  string provider_string;
  unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
  bound_info;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  scope_strings;
  string type_string;
  undefined1 local_390 [8];
  undefined1 local_388 [72];
  pointer local_340;
  undefined1 local_338 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  optional_idx oStack_308;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_300;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2f8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> vStack_2f0;
  __node_base local_2d8;
  element_type *peStack_2d0;
  ClientContext *local_2c8;
  undefined1 local_2b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  Val local_298;
  undefined1 local_288 [16];
  Val local_278;
  char local_268 [16];
  _Alloc_hider local_258;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_238 [24];
  pointer local_220;
  pointer local_218;
  __node_base local_210;
  __buckets_ptr local_208;
  size_type local_200;
  __node_base _Stack_1f8;
  __node_base_ptr local_1f0;
  OnCreateConflict local_1e8;
  SecretPersistType local_1e7;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1d8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1d0;
  CreateInfo *local_1c8;
  DatabaseInstance *local_1c0;
  undefined1 local_1b8 [40];
  __node_base local_190;
  optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> local_188;
  __buckets_ptr local_180;
  undefined1 local_178 [16];
  undefined1 local_168 [104];
  _Alloc_hider local_100;
  char local_f0 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  __node_base local_b8;
  __node_base_ptr local_b0;
  _Hash_node_base local_a8 [2];
  _Any_data local_98;
  __buckets_ptr local_88;
  code *pcStack_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  undefined1 local_50 [32];
  
  local_2d8._M_nxt = (_Hash_node_base *)0x0;
  peStack_2d0 = (element_type *)0x0;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2f8._M_head_impl = (LogicalOperator *)0x0;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2c8 = (ClientContext *)0x0;
  local_2b8._0_8_ = &local_2a8;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Count","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_2b8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_388,__l,(allocator_type *)local_338);
  local_168._16_8_ = local_2c8;
  local_168._8_8_ = peStack_2d0;
  local_168._0_8_ = local_2d8._M_nxt;
  local_2d8._M_nxt = (_Hash_node_base *)local_388._0_8_;
  peStack_2d0 = (element_type *)local_388._8_8_;
  local_2c8 = (ClientContext *)local_388._16_8_;
  local_388._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  local_388._8_8_ = (element_type *)0x0;
  local_388._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_388);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
  LogicalType::LogicalType((LogicalType *)local_388,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_388;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_168,__l_00,
             (allocator_type *)local_338);
  local_2a8._M_allocated_capacity =
       (size_type)
       vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_2b8._8_8_ =
       vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_2b8._0_8_ =
       vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_168._0_8_;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_168._8_8_;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_168._16_8_;
  local_168._0_8_ =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       0x0;
  local_168._8_8_ = (element_type *)0x0;
  local_168._16_8_ = (ClientContext *)0x0;
  local_190._M_nxt = (_Hash_node_base *)__return_storage_ptr__;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2b8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_168);
  LogicalType::~LogicalType((LogicalType *)local_388);
  this_00 = &stmt->info;
  pCVar12 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(this_00);
  bVar2 = (pCVar12->super_ParseInfo).field_0x9;
  this_02 = GetStatementProperties(this);
  if (0x1d < bVar2) {
    if (bVar2 == 0x1e) {
      pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      oVar25.ptr = BindCreateFunctionInfo(this,pCVar24);
      _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
      local_2b8._0_8_ =
           (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
           super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      LogicalCreate::LogicalCreate
                ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_MACRO,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 local_2b8,oVar25);
    }
    else {
      if (bVar2 != 0x1f) {
        if (bVar2 != 0x47) goto switchD_011d9f69_caseD_5;
        pCVar15 = Catalog::GetSystemCatalog(this->context);
        CatalogTransaction::CatalogTransaction
                  ((CatalogTransaction *)local_1b8,pCVar15,this->context);
        this_02->return_type = QUERY_RESULT;
        local_340 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                    operator->(this_00);
        pCVar3 = this->context;
        local_50._0_8_ = (pointer)(local_50 + 0x10);
        ::std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Secret Parameter","");
        ConstantBinder::ConstantBinder((ConstantBinder *)local_168,this,pCVar3,(string *)local_50);
        if ((pointer)local_50._0_8_ != (pointer)(local_50 + 0x10)) {
          operator_delete((void *)local_50._0_8_);
        }
        local_188.ptr = (vector<duckdb::DummyBinding,_true> *)local_178;
        local_180 = (__buckets_ptr)0x0;
        local_178[0] = 0;
        local_b8._M_nxt = local_a8;
        local_b0 = (__node_base_ptr)0x0;
        local_a8[0]._M_nxt._0_1_ = 0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if (local_340[1].schema._M_dataplus._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_390,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_168,(optional_ptr<duckdb::LogicalType,_true>)&local_340[1].schema,
                     false);
          pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_390);
          iVar11 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[6])(pEVar16);
          if ((char)iVar11 != '\0') {
            pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2b8._0_8_ = &local_2a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar29,(string *)local_2b8);
            __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_390);
          ExpressionExecutor::EvaluateScalar((Value *)local_2b8,pCVar3,pEVar17,true);
          Value::ToString_abi_cxx11_((string *)local_338,(Value *)local_2b8);
          StringUtil::Lower((string *)local_388,(string *)local_338);
          ::std::__cxx11::string::operator=((string *)&local_188,(string *)local_388);
          if ((LogicalOperator *)local_388._0_8_ != (LogicalOperator *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_);
          }
          if (local_338._0_8_ != (long)local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_);
          }
          Value::~Value((Value *)local_2b8);
          if (local_390 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_390)->_vptr_BaseExpression[1])();
          }
        }
        if (*(long *)&local_340[1].super_ParseInfo.info_type != 0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_390,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_168,
                     (optional_ptr<duckdb::LogicalType,_true>)
                     &local_340[1].super_ParseInfo.info_type,false);
          pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_390);
          iVar11 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[6])(pEVar16);
          if ((char)iVar11 != '\0') {
            pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2b8._0_8_ = &local_2a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar29,(string *)local_2b8);
            __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_390);
          ExpressionExecutor::EvaluateScalar((Value *)local_2b8,pCVar3,pEVar17,true);
          Value::ToString_abi_cxx11_((string *)local_338,(Value *)local_2b8);
          StringUtil::Lower((string *)local_388,(string *)local_338);
          ::std::__cxx11::string::operator=((string *)&local_b8,(string *)local_388);
          if ((BaseTableRef *)local_388._0_8_ != (BaseTableRef *)(local_388 + 0x10)) {
            operator_delete((void *)local_388._0_8_);
          }
          if (local_338._0_8_ != (long)local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_);
          }
          Value::~Value((Value *)local_2b8);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_390 != (Expression *)0x0) {
            (**(code **)(*(_func_int **)local_390 + 8))();
          }
        }
        if (local_340[1].sql._M_dataplus._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_390,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_168,(optional_ptr<duckdb::LogicalType,_true>)&local_340[1].sql,false);
          pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_390);
          iVar11 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[6])(pEVar16);
          if ((char)iVar11 != '\0') {
            pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2b8._0_8_ = &local_2a8;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2b8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar29,(string *)local_2b8);
            __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar3 = this->context;
          pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_390);
          ExpressionExecutor::EvaluateScalar((Value *)local_2b8,pCVar3,pEVar17,true);
          LogicalType::LogicalType((LogicalType *)local_388,VARCHAR);
          bVar10 = LogicalType::operator==((LogicalType *)local_2b8,(LogicalType *)local_388);
          LogicalType::~LogicalType((LogicalType *)local_388);
          if (bVar10) {
            Value::ToString_abi_cxx11_((string *)local_388,(Value *)local_2b8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_388);
            if ((BaseTableRef *)local_388._0_8_ != (BaseTableRef *)(local_388 + 0x10)) {
              operator_delete((void *)local_388._0_8_);
            }
          }
          else {
            LogicalType::LogicalType((LogicalType *)local_338,VARCHAR);
            LogicalType::LIST((LogicalType *)local_388,(LogicalType *)local_338);
            bVar10 = LogicalType::operator==((LogicalType *)local_2b8,(LogicalType *)local_388);
            LogicalType::~LogicalType((LogicalType *)local_388);
            LogicalType::~LogicalType((LogicalType *)local_338);
            if (bVar10) {
              pvVar28 = ListValue::GetChildren((Value *)local_2b8);
              pVVar32 = (pvVar28->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pVVar5 = (pvVar28->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pVVar32 != pVVar5) {
                do {
                  Value::GetValue<std::__cxx11::string>((string *)local_388,pVVar32);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_d8,(string *)local_388);
                  if ((LogicalOperator *)local_388._0_8_ != (LogicalOperator *)(local_388 + 0x10)) {
                    operator_delete((void *)local_388._0_8_);
                  }
                  pVVar32 = pVVar32 + 1;
                } while (pVVar32 != pVVar5);
              }
            }
            else {
              if (local_2b8[1] != STRUCT) {
                pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                local_388._0_8_ = (long)local_388 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_388,
                           "Create Secret scope must be of type VARCHAR or LIST(VARCHAR)","");
                InvalidInputException::InvalidInputException(pIVar29,(string *)local_388);
                __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pvVar28 = StructValue::GetChildren((Value *)local_2b8);
              pVVar32 = (pvVar28->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pVVar5 = (pvVar28->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pVVar32 != pVVar5) {
                do {
                  LogicalType::LogicalType((LogicalType *)local_388,VARCHAR);
                  bVar10 = LogicalType::operator==(&pVVar32->type_,(LogicalType *)local_388);
                  LogicalType::~LogicalType((LogicalType *)local_388);
                  if (!bVar10) {
                    pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                    local_388._0_8_ = (LogicalOperator *)(local_388 + 0x10);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_388,
                               "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed"
                               ,"");
                    InvalidInputException::InvalidInputException(pIVar29,(string *)local_388);
                    __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  Value::GetValue<std::__cxx11::string>((string *)local_388,pVVar32);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_d8,(string *)local_388);
                  if ((LogicalOperator *)local_388._0_8_ != (LogicalOperator *)(local_388 + 0x10)) {
                    operator_delete((void *)local_388._0_8_);
                  }
                  pVVar32 = pVVar32 + 1;
                } while (pVVar32 != pVVar5);
              }
            }
          }
          Value::~Value((Value *)local_2b8);
          if (local_390 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_390)->_vptr_BaseExpression[1])();
          }
        }
        local_338._0_8_ = &oStack_308;
        local_338._8_8_ = &DAT_00000001;
        local_338._16_8_ = 0;
        local_338._24_8_ = 0;
        local_318._M_allocated_capacity._0_4_ = 0x3f800000;
        local_318._8_8_ = (_Hash_node_base *)0x0;
        oStack_308.index = 0;
        plVar34 = *(long **)((long)&local_340[1].sql.field_2 + 8);
        if (plVar34 != (long *)0x0) {
          do {
            ExpressionBinder::Bind
                      ((ExpressionBinder *)local_390,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_168,(LogicalType *)(plVar34 + 5),false);
            pEVar16 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_390);
            iVar11 = (*(pEVar16->super_BaseExpression)._vptr_BaseExpression[6])(pEVar16);
            if ((char)iVar11 != '\0') {
              pIVar29 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_2b8._0_8_ = &local_2a8;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2b8,"Create Secret expressions can not have parameters!",""
                        );
              InvalidInputException::InvalidInputException(pIVar29,(string *)local_2b8);
              __cxa_throw(pIVar29,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pCVar3 = this->context;
            pEVar17 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                   *)local_390);
            ExpressionExecutor::EvaluateScalar((Value *)local_388,pCVar3,pEVar17,true);
            local_2b8._0_8_ = &local_2a8;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2b8,plVar34[1],plVar34[2] + plVar34[1]);
            Value::Value((Value *)&local_298.hugeint,(Value *)local_388);
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,duckdb::Value>>
                      (local_338,
                       (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2b8);
            Value::~Value((Value *)&local_298.hugeint);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2b8._0_8_ != &local_2a8) {
              operator_delete((void *)local_2b8._0_8_);
            }
            Value::~Value((Value *)local_388);
            if (local_390 != (undefined1  [8])0x0) {
              (*((BaseExpression *)local_390)->_vptr_BaseExpression[1])();
            }
            plVar34 = (long *)*plVar34;
          } while (plVar34 != (long *)0x0);
        }
        local_2b8._0_8_ = &local_2a8;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2b8,local_b8._M_nxt,
                   (long)&local_b0->_M_nxt + (long)local_b8._M_nxt);
        local_298.bigint = (int64_t)local_288;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,local_188.ptr,
                   (undefined1 *)((long)local_180 + (long)local_188.ptr));
        pCVar12 = local_340;
        pcVar6 = local_340[1].catalog._M_dataplus._M_p;
        local_278.bigint = (int64_t)local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar6,pcVar6 + local_340[1].catalog._M_string_length);
        ppCVar1 = &local_250.
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        sVar7 = pCVar12[1].schema._M_string_length;
        local_258._M_p = (pointer)ppCVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_258,sVar7,
                   pCVar12[1].schema.field_2._M_allocated_capacity + sVar7);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_238,&local_d8);
        local_220 = (pointer)0x0;
        local_218 = (pointer)local_338._8_8_;
        local_210._M_nxt = (_Hash_node_base *)0x0;
        local_208 = (__buckets_ptr)local_338._24_8_;
        local_200 = CONCAT44(local_318._M_allocated_capacity._4_4_,
                             local_318._M_allocated_capacity._0_4_);
        _Stack_1f8._M_nxt = (_Hash_node_base *)local_318._8_8_;
        local_1f0 = (__node_base_ptr)0x0;
        local_388._0_8_ = &local_220;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_220,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)local_338,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                    *)local_388);
        local_1e8 = *(OnCreateConflict *)&local_340[1].super_ParseInfo._vptr_ParseInfo;
        local_1e7 = *(SecretPersistType *)((long)&local_340[1].super_ParseInfo._vptr_ParseInfo + 1);
        this_07 = SecretManager::Get(this->context);
        transaction_00.context.ptr = (ClientContext *)local_1b8._8_8_;
        transaction_00.db.ptr = (DatabaseInstance *)local_1b8._0_8_;
        transaction_00.transaction.ptr = (Transaction *)local_1b8._16_8_;
        transaction_00.transaction_id = local_1b8._24_8_;
        transaction_00.start_time = local_1b8._32_8_;
        SecretManager::BindCreateSecret
                  ((BoundStatement *)local_190._M_nxt,this_07,transaction_00,
                   (CreateSecretInput *)local_2b8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_220);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_238);
        if ((pointer *)local_258._M_p != ppCVar1) {
          operator_delete(local_258._M_p);
        }
        _Var31._M_nxt = local_190._M_nxt;
        if (local_278._0_8_ != local_268) {
          operator_delete((void *)local_278.bigint);
        }
        if (local_298._0_8_ != local_288) {
          operator_delete((void *)local_298.bigint);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ != &local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_338);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_d8);
        if (local_b8._M_nxt != local_a8) {
          operator_delete(local_b8._M_nxt);
        }
        if (local_188.ptr != (vector<duckdb::DummyBinding,_true> *)local_178) {
          operator_delete(local_188.ptr);
        }
        local_168._0_8_ = &PTR__ConstantBinder_0248e6f0;
        if (local_100._M_p != local_f0) {
          operator_delete(local_100._M_p);
        }
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_168);
        goto LAB_011dad84;
      }
      pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      oVar25.ptr = BindCreateSchema(this,pCVar24);
      _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
      local_2b8._0_8_ =
           (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
           ._M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
           super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      LogicalCreate::LogicalCreate
                ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_MACRO,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 local_2b8,oVar25);
    }
    goto LAB_011dacda;
  }
  switch(bVar2) {
  case 1:
    local_1c8 = (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    BindCreateTableInfo((Binder *)local_168,
                        (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)this);
    if (local_1c8 != (CreateInfo *)0x0) {
      (**(code **)((long)(local_1c8->super_ParseInfo)._vptr_ParseInfo + 8))();
    }
    local_1c8 = (CreateInfo *)0x0;
    pBVar13 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)local_168);
    local_388._0_8_ =
         (pBVar13->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar13->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    pBVar13 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)local_168);
    schema = pBVar13->schema;
    this_03.
    super__Tuple_impl<0UL,_duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>
    .super__Head_base<0UL,_duckdb::LogicalCreateTable_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>
          )operator_new(0x78);
    local_2b8._0_8_ = local_168._0_8_;
    local_168._0_8_ = (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0;
    LogicalCreateTable::LogicalCreateTable
              ((LogicalCreateTable *)
               this_03.
               super__Tuple_impl<0UL,_duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>
               .super__Head_base<0UL,_duckdb::LogicalCreateTable_*,_false>._M_head_impl,schema,
               (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                *)local_2b8);
    local_338._0_8_ =
         this_03.
         super__Tuple_impl<0UL,_duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>
         .super__Head_base<0UL,_duckdb::LogicalCreateTable_*,_false>._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_2b8,
                 (BoundCreateTableInfo *)local_2b8._0_8_);
    }
    if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
        local_388._0_8_ != (LogicalOperator *)0x0) {
      this_02->return_type = CHANGED_ROWS;
      pLVar14 = unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                              *)local_338);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar14->super_LogicalOperator).children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_388);
    }
    _Var26._M_head_impl = local_2f8._M_head_impl;
    local_2f8._M_head_impl = (LogicalOperator *)local_338._0_8_;
    local_338._0_8_ =
         (tuple<duckdb::LogicalCreateTable_*,_std::default_delete<duckdb::LogicalCreateTable>_>)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var26._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(_Var26._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity + 8))()
      ;
    }
    if ((LogicalCreateTable *)local_338._0_8_ != (LogicalCreateTable *)0x0) {
      (*((LogicalOperator *)local_338._0_8_)->_vptr_LogicalOperator[1])();
    }
    if ((BaseTableRef *)local_388._0_8_ != (BaseTableRef *)0x0) {
      (**(code **)(*(long *)local_388._0_8_ + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_168,
                 (BoundCreateTableInfo *)local_168._0_8_);
    }
    goto LAB_011dad08;
  case 2:
    pCVar12 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    BindCatalog((string *)local_2b8,this,&pCVar12->catalog);
    pCVar15 = Catalog::GetCatalog(this->context,(string *)local_2b8);
    StatementProperties::RegisterDBModify(this_02,pCVar15,this->context);
    _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
    local_168._0_8_ =
         (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
         .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_SCHEMA,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_168,(optional_ptr<duckdb::SchemaCatalogEntry,_true>)0x0);
    if ((tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
        local_168._0_8_ != (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0) {
      (**(code **)(*(size_type *)local_168._0_8_ + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(local_2f8._M_head_impl)->_vptr_LogicalOperator;
      local_2f8._M_head_impl = _Var26._M_head_impl;
      (**(code **)(paVar23->_M_allocated_capacity + 8))();
      _Var26._M_head_impl = local_2f8._M_head_impl;
    }
    break;
  case 3:
    base = (CreateViewInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (this_00);
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar25.ptr = BindCreateSchema(this,pCVar24);
    BindCreateViewInfo(this,base);
    _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
    local_2b8._0_8_ =
         (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
         .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_VIEW,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2b8,oVar25);
    goto LAB_011dacda;
  case 4:
    pCVar12 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    TableDescription::TableDescription
              ((TableDescription *)local_2b8,&pCVar12->catalog,&pCVar12->schema,
               (string *)(pCVar12 + 1));
    this_04._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
         operator_new(0xd0);
    BaseTableRef::BaseTableRef
              ((BaseTableRef *)
               this_04._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (TableDescription *)local_2b8);
    local_388._0_8_ =
         this_04._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
               local_388);
    Bind((Binder *)local_338,(BaseTableRef *)this);
    pBVar18 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)local_338);
    if (pBVar18->type != BASE_TABLE) {
      pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = (long)local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"can only create an index on a base table","");
      BinderException::BinderException(pBVar30,(string *)local_168);
      __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pBVar18 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)local_338);
    pBVar19 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar18);
    pTVar4 = pBVar19->table;
    if ((pTVar4->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == true) {
      pCVar12 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_00);
      pCVar12->temporary = true;
    }
    StatementProperties::RegisterDBModify
              (this_02,(pTVar4->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)local_338);
    CreatePlan((Binder *)local_1b8,(BoundTableRef *)this);
    pLVar21 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1b8);
    if (pLVar21->type != LOGICAL_GET) {
      pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = (long)local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"Cannot create index on a view!","");
      BinderException::BinderException(pBVar30,(string *)local_168);
      __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar15 = (pTVar4->super_StandardEntry).super_InCatalogEntry.catalog;
    local_1c0 = (DatabaseInstance *)local_1b8._0_8_;
    local_1b8._0_8_ = (DatabaseInstance *)0x0;
    (*pCVar15->_vptr_Catalog[0x11])(local_168,pCVar15,this,stmt,pTVar4);
    uVar8 = local_168._0_8_;
    _Var26._M_head_impl = local_2f8._M_head_impl;
    local_168._0_8_ = (BoundCreateTableInfo *)0x0;
    local_2f8._M_head_impl = (LogicalOperator *)uVar8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var26._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(_Var26._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity + 8))()
      ;
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
         )local_168._0_8_ != (BoundCreateTableInfo *)0x0) {
      (**(code **)(*(long *)local_168._0_8_ + 8))();
    }
    local_168._0_8_ =
         (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
         0x0;
    if (local_1c0 != (DatabaseInstance *)0x0) {
      (*(code *)(((local_1c0->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                  internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_1c0 = (DatabaseInstance *)0x0;
    if ((DatabaseInstance *)local_1b8._0_8_ != (DatabaseInstance *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)local_1b8._0_8_)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if ((LogicalCreateTable *)local_338._0_8_ != (LogicalCreateTable *)0x0) {
      (*((LogicalOperator *)local_338._0_8_)->_vptr_LogicalOperator[1])();
    }
    if ((LogicalOperator *)local_388._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_388._0_8_ + 8))();
    }
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
              (&local_250);
    if (local_278._0_8_ != local_268) {
      operator_delete((void *)local_278.bigint);
    }
    _Var26._M_head_impl = local_2f8._M_head_impl;
    if (local_298._0_8_ != local_288) {
      operator_delete((void *)local_298.bigint);
      _Var26._M_head_impl = local_2f8._M_head_impl;
    }
    break;
  default:
switchD_011d9f69_caseD_5:
    this_08 = (InternalException *)__cxa_allocate_exception(0x10);
    local_2b8._0_8_ = &local_2a8;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"Unrecognized type!","");
    InternalException::InternalException(this_08,(string *)local_2b8);
    __cxa_throw(this_08,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 6:
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar25.ptr = BindCreateSchema(this,pCVar24);
    _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
    local_2b8._0_8_ =
         (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
         .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_SEQUENCE,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2b8,oVar25);
LAB_011dacda:
    _Var33._M_head_impl = local_2f8._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2b8._0_8_ + 8))();
      _Var33._M_head_impl = local_2f8._M_head_impl;
    }
LAB_011dacfd:
    local_2f8._M_head_impl = _Var26._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var33._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var33._M_head_impl + 8))();
    }
    goto LAB_011dad08;
  case 8:
    pCVar24 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar25.ptr = BindCreateSchema(this,pCVar24);
    pCVar12 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    _Var26._M_head_impl = (LogicalOperator *)operator_new(0x78);
    local_2b8._0_8_ =
         (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
         .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var26._M_head_impl,LOGICAL_CREATE_TYPE,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2b8,oVar25);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)local_2b8._0_8_ + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(local_2f8._M_head_impl)->_vptr_LogicalOperator;
      local_2f8._M_head_impl = _Var26._M_head_impl;
      (**(code **)(paVar23->_M_allocated_capacity + 8))();
      _Var26._M_head_impl = local_2f8._M_head_impl;
    }
    local_2f8._M_head_impl = _Var26._M_head_impl;
    pCVar15 = Catalog::GetCatalog(this->context,&pCVar12->catalog);
    if (pCVar12[1].schema._M_string_length == 0) {
      paVar23 = &pCVar12[1].catalog.field_2;
      if (pCVar12[1].catalog.field_2._M_local_buf[0] == '\x04') {
        pcStack_60 = ::std::
                     _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                     ::_M_invoke;
        local_68 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_manager;
        local_78._M_unused._M_object = &pCVar12->dependencies;
        local_78._8_8_ = pCVar15;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
        psVar27 = UserType::GetTypeName_abi_cxx11_((LogicalType *)paVar23);
        EntryLookupInfo::EntryLookupInfo
                  ((EntryLookupInfo *)local_2b8,TYPE_ENTRY,psVar27,
                   (QueryErrorContext)0xffffffffffffffff);
        psVar27 = Catalog::GetName_abi_cxx11_(((oVar25.ptr)->super_InCatalogEntry).catalog);
        local_168._0_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,psVar27,
                        &((oVar25.ptr)->super_InCatalogEntry).super_CatalogEntry.name,
                        (EntryLookupInfo *)local_2b8,THROW_EXCEPTION);
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)local_168);
        if (paVar23 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)&(((LogicalDependencyList *)(local_168._0_8_ + 0x108))->set)._M_h._M_element_count) {
          pCVar12[1].catalog.field_2._M_local_buf[0] =
               *(char *)&(((LogicalDependencyList *)(local_168._0_8_ + 0x108))->set)._M_h.
                         _M_element_count;
          pCVar12[1].catalog.field_2._M_local_buf[1] =
               *(undefined1 *)
                ((long)&(((LogicalDependencyList *)(local_168._0_8_ + 0x108))->set)._M_h.
                        _M_element_count + 1);
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     ((long)&pCVar12[1].catalog.field_2 + 8),
                     (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     &(((LogicalDependencyList *)(local_168._0_8_ + 0x108))->set)._M_h.
                      _M_rehash_policy);
        }
      }
      else {
        pcStack_80 = ::std::
                     _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                     ::_M_invoke;
        local_88 = (__buckets_ptr)
                   ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_manager;
        local_98._M_unused._M_object = &pCVar12->dependencies;
        local_98._8_8_ = pCVar15;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_98);
        if (local_88 != (__buckets_ptr)0x0) {
          (*(code *)local_88)(&local_98,&local_98,3);
        }
        LogicalType::LogicalType((LogicalType *)local_168,(LogicalType *)paVar23);
        local_2b8._0_8_ = &local_2a8;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2b8,anon_var_dwarf_63b5960 + 9);
        BindLogicalType(this,(LogicalType *)paVar23,(optional_ptr<duckdb::Catalog,_true>)0x0,
                        (string *)local_2b8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._0_8_ != &local_2a8) {
          operator_delete((void *)local_2b8._0_8_);
        }
        if ((LogicalType *)paVar23 != (LogicalType *)local_168) {
          pCVar12[1].catalog.field_2._M_local_buf[0] = (char)local_168[0];
          pCVar12[1].catalog.field_2._M_local_buf[1] = local_168[1];
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     ((long)&pCVar12[1].catalog.field_2 + 8),
                     (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_168 + 8));
        }
        LogicalType::~LogicalType((LogicalType *)local_168);
      }
      goto LAB_011dad08;
    }
    this_09 = &pCVar12[1].schema._M_string_length;
    statement = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
                operator*((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)this_09);
    Bind((BoundStatement *)local_2b8,this,statement);
    local_1b8._0_8_ = local_2b8._0_8_;
    local_2b8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    plVar34 = (long *)*this_09;
    *this_09 = 0;
    if (plVar34 != (long *)0x0) {
      (**(code **)(*plVar34 + 8))();
    }
    if (local_2a8._M_allocated_capacity - local_2b8._8_8_ != 0x18) {
      pBVar30 = (BinderException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = (long)local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"The query must return a single column","");
      BinderException::BinderException(pBVar30,(string *)local_168);
      __cxa_throw(pBVar30,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    this_01 = (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)(local_2b8 + 8);
    pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)this_01,0);
    if (pvVar20->id_ != VARCHAR) {
      local_388._0_8_ =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
      local_388._8_8_ = (element_type *)0x0;
      local_388._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pvVar20 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)this_01,0);
      pLVar21 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_1b8);
      (*pLVar21->_vptr_LogicalOperator[2])(local_338);
      pvVar22 = vector<duckdb::ColumnBinding,_true>::operator[]
                          ((vector<duckdb::ColumnBinding,_true> *)local_338,0);
      this_05 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_168,pvVar20);
      binding.table_index = pvVar22->table_index;
      binding.column_index = pvVar22->column_index;
      BoundColumnRefExpression::BoundColumnRefExpression(this_05,(LogicalType *)local_168,binding,0)
      ;
      LogicalType::~LogicalType((LogicalType *)local_168);
      if ((LogicalCreateTable *)local_338._0_8_ != (LogicalCreateTable *)0x0) {
        operator_delete((void *)local_338._0_8_);
      }
      pCVar3 = this->context;
      local_300._M_head_impl = (Expression *)this_05;
      LogicalType::LogicalType((LogicalType *)local_168,VARCHAR);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)local_338,pCVar3,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_300,(LogicalType *)local_168,false);
      LogicalType::~LogicalType((LogicalType *)local_168);
      if ((BoundColumnRefExpression *)local_300._M_head_impl != (BoundColumnRefExpression *)0x0) {
        (*(((Expression *)&(local_300._M_head_impl)->super_BaseExpression)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_300._M_head_impl = (Expression *)0x0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_388,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 local_338);
      table_index = GenerateTableIndex(this);
      paVar23 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x70);
      local_168._0_8_ = local_388._0_8_;
      local_168._8_8_ = local_388._8_8_;
      local_168._16_8_ = local_388._16_8_;
      local_388._0_8_ =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
      local_388._8_8_ = (element_type *)0x0;
      local_388._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)paVar23,table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_168);
      local_188.ptr = (vector<duckdb::DummyBinding,_true> *)paVar23;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_168);
      this_06 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_188);
      local_1d0._M_head_impl = (LogicalOperator *)local_1b8._0_8_;
      local_1b8._0_8_ = (DatabaseInstance *)0x0;
      LogicalOperator::AddChild
                (&this_06->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_1d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_1d0._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity +
                    8))();
      }
      oVar9.ptr = local_188.ptr;
      uVar8 = local_1b8._0_8_;
      local_1d0._M_head_impl = (LogicalOperator *)0x0;
      local_188.ptr = (vector<duckdb::DummyBinding,_true> *)0x0;
      local_1b8._0_8_ = oVar9.ptr;
      if ((DatabaseInstance *)uVar8 != (DatabaseInstance *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)uVar8)->__weak_this_).
                    internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                  internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      if (local_188.ptr != (vector<duckdb::DummyBinding,_true> *)0x0) {
        (**(code **)&((((local_188.ptr)->
                       super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>).
                       super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_Binding).binding_type)();
      }
      if ((LogicalCreateTable *)local_338._0_8_ != (LogicalCreateTable *)0x0) {
        (**(code **)(*(idx_t *)local_338._0_8_ + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_388);
    }
    pLVar21 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_2f8);
    local_1d8._M_head_impl = (LogicalOperator *)local_1b8._0_8_;
    local_1b8._0_8_ = (DatabaseInstance *)0x0;
    LogicalOperator::AddChild
              (pLVar21,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_1d8._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity + 8)
      )();
    }
    local_1d8._M_head_impl = (LogicalOperator *)0x0;
    if ((DatabaseInstance *)local_1b8._0_8_ != (DatabaseInstance *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)local_1b8._0_8_)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_298.hugeint);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(this_01);
    _Var33._M_head_impl = (LogicalOperator *)local_2b8._0_8_;
    _Var26._M_head_impl = local_2f8._M_head_impl;
    goto LAB_011dacfd;
  }
  local_2f8._M_head_impl = _Var26._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._0_8_ != &local_2a8) {
    operator_delete((void *)local_2b8._0_8_);
  }
LAB_011dad08:
  this_02->return_type = NOTHING;
  this_02->allow_stream_result = false;
  (((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> *)
   &((Binding *)&(local_190._M_nxt)->_M_nxt)->_vptr_Binding)->_M_t).
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_2f8._M_head_impl;
  local_2f8._M_head_impl = (LogicalOperator *)0x0;
  (((vector<duckdb::LogicalType,_true> *)(local_190._M_nxt + 1))->
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (((BindingAlias *)(local_190._M_nxt + 2))->catalog)._M_dataplus._M_p =
       (pointer)vStack_2f0.
                super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_190._M_nxt[3] =
       (_Hash_node_base)
       vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vStack_2f0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)(local_190._M_nxt + 4))->_M_allocated_capacity = (size_type)local_2d8._M_nxt;
  local_190._M_nxt[5] = (_Hash_node_base)peStack_2d0;
  (((string *)(local_190._M_nxt + 6))->_M_dataplus)._M_p = (pointer)local_2c8;
  local_2c8 = (ClientContext *)0x0;
  local_2d8._M_nxt = (_Hash_node_base *)0x0;
  peStack_2d0 = (element_type *)0x0;
  _Var31._M_nxt = local_190._M_nxt;
LAB_011dad84:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2d8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&vStack_2f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_2f8._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity + 8))
              ();
  }
  return (BoundStatement *)(DummyBinding *)_Var31._M_nxt;
}

Assistant:

BoundStatement Binder::Bind(CreateStatement &stmt) {
	BoundStatement result;
	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};

	auto catalog_type = stmt.info->type;
	auto &properties = GetStatementProperties();
	switch (catalog_type) {
	case CatalogType::SCHEMA_ENTRY: {
		auto &base = stmt.info->Cast<CreateInfo>();
		auto catalog = BindCatalog(base.catalog);
		properties.RegisterDBModify(Catalog::GetCatalog(context, catalog), context);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SCHEMA, std::move(stmt.info));
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		auto &base = stmt.info->Cast<CreateViewInfo>();
		// bind the schema
		auto &schema = BindCreateSchema(*stmt.info);
		BindCreateViewInfo(base);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_VIEW, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SEQUENCE, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		auto &schema = BindCreateFunctionInfo(*stmt.info);
		auto logical_create =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		result.plan = std::move(logical_create);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		auto &create_index_info = stmt.info->Cast<CreateIndexInfo>();

		// Plan the table scan.
		TableDescription table_description(create_index_info.catalog, create_index_info.schema,
		                                   create_index_info.table);
		auto table_ref = make_uniq<BaseTableRef>(table_description);
		auto bound_table = Bind(*table_ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw BinderException("can only create an index on a base table");
		}

		auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
		auto &table = table_binding.table;
		if (table.temporary) {
			stmt.info->temporary = true;
		}
		properties.RegisterDBModify(table.catalog, context);

		// create a plan over the bound table
		auto plan = CreatePlan(*bound_table);
		if (plan->type != LogicalOperatorType::LOGICAL_GET) {
			throw BinderException("Cannot create index on a view!");
		}

		result.plan = table.catalog.BindCreateIndex(*this, stmt, table, std::move(plan));
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		auto bound_info = BindCreateTableInfo(std::move(stmt.info));
		auto root = std::move(bound_info->query);

		// create the logical operator
		auto &schema = bound_info->schema;
		auto create_table = make_uniq<LogicalCreateTable>(schema, std::move(bound_info));
		if (root) {
			// CREATE TABLE AS
			properties.return_type = StatementReturnType::CHANGED_ROWS;
			create_table->children.push_back(std::move(root));
		}
		result.plan = std::move(create_table);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		auto &create_type_info = stmt.info->Cast<CreateTypeInfo>();
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_TYPE, std::move(stmt.info), &schema);

		auto &catalog = Catalog::GetCatalog(context, create_type_info.catalog);
		auto &dependencies = create_type_info.dependencies;
		auto dependency_callback = [&dependencies, &catalog](CatalogEntry &entry) {
			if (&catalog != &entry.ParentCatalog()) {
				// Don't register any cross-catalog dependencies
				return;
			}
			dependencies.AddDependency(entry);
		};
		if (create_type_info.query) {
			// CREATE TYPE mood AS ENUM (SELECT 'happy')
			auto query_obj = Bind(*create_type_info.query);
			auto query = std::move(query_obj.plan);
			create_type_info.query.reset();

			auto &sql_types = query_obj.types;
			if (sql_types.size() != 1) {
				// add cast expression?
				throw BinderException("The query must return a single column");
			}
			if (sql_types[0].id() != LogicalType::VARCHAR) {
				// push a projection casting to varchar
				vector<unique_ptr<Expression>> select_list;
				auto ref = make_uniq<BoundColumnRefExpression>(sql_types[0], query->GetColumnBindings()[0]);
				auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(ref), LogicalType::VARCHAR);
				select_list.push_back(std::move(cast_expr));
				auto proj = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(select_list));
				proj->AddChild(std::move(query));
				query = std::move(proj);
			}

			result.plan->AddChild(std::move(query));
		} else if (create_type_info.type.id() == LogicalTypeId::USER) {
			SetCatalogLookupCallback(dependency_callback);
			// two cases:
			// 1: create a type with a non-existent type as source, Binder::BindLogicalType(...) will throw exception.
			// 2: create a type alias with a custom type.
			// eg. CREATE TYPE a AS INT; CREATE TYPE b AS a;
			// We set b to be an alias for the underlying type of a

			EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, UserType::GetTypeName(create_type_info.type));
			auto type_entry_p = entry_retriever.GetEntry(schema.catalog.GetName(), schema.name, type_lookup);
			D_ASSERT(type_entry_p);
			auto &type_entry = type_entry_p->Cast<TypeCatalogEntry>();
			create_type_info.type = type_entry.user_type;
		} else {
			SetCatalogLookupCallback(dependency_callback);
			// This is done so that if the type contains a USER type,
			// we register this dependency
			auto preserved_type = create_type_info.type;
			BindLogicalType(create_type_info.type);
			create_type_info.type = preserved_type;
		}
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		CatalogTransaction transaction = CatalogTransaction(Catalog::GetSystemCatalog(context), context);
		properties.return_type = StatementReturnType::QUERY_RESULT;

		auto &info = stmt.info->Cast<CreateSecretInfo>();

		// We need to execute all expressions in the CreateSecretInfo to construct a CreateSecretInput
		ConstantBinder default_binder(*this, context, "Secret Parameter");

		string provider_string, type_string;
		vector<string> scope_strings;

		if (info.provider) {
			auto bound_provider = default_binder.Bind(info.provider);
			if (bound_provider->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			provider_string =
			    StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_provider, true).ToString());
		}
		if (info.type) {
			auto bound_type = default_binder.Bind(info.type);
			if (bound_type->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			type_string = StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_type, true).ToString());
		}
		if (info.scope) {
			auto bound_scope = default_binder.Bind(info.scope);
			if (bound_scope->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			// Execute all scope expressions
			Value scope = ExpressionExecutor::EvaluateScalar(context, *bound_scope, true);
			if (scope.type() == LogicalType::VARCHAR) {
				scope_strings.push_back(scope.ToString());
			} else if (scope.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
				for (const auto &item : ListValue::GetChildren(scope)) {
					scope_strings.push_back(item.GetValue<string>());
				}
			} else if (scope.type().InternalType() == PhysicalType::STRUCT) {
				// struct expression with empty keys is also allowed for backwards compatibility to when the create
				// secret statement would be parsed differently: this allows CREATE SECRET (TYPE x, SCOPE ('bla',
				// 'bloe'))
				for (const auto &child : StructValue::GetChildren(scope)) {
					if (child.type() != LogicalType::VARCHAR) {
						throw InvalidInputException(
						    "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed");
					}
					scope_strings.push_back(child.GetValue<string>());
				}
			} else {
				throw InvalidInputException("Create Secret scope must be of type VARCHAR or LIST(VARCHAR)");
			}
		}

		// Execute all options expressions
		case_insensitive_map_t<Value> bound_options;
		for (auto &option : info.options) {
			auto bound_value = default_binder.Bind(option.second);
			if (bound_value->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			bound_options.insert({option.first, ExpressionExecutor::EvaluateScalar(context, *bound_value, true)});
		}

		CreateSecretInput create_secret_input {type_string,   provider_string, info.storage_type, info.name,
		                                       scope_strings, bound_options,   info.on_conflict,  info.persist_type};

		return SecretManager::Get(context).BindCreateSecret(transaction, create_secret_input);
	}
	default:
		throw InternalException("Unrecognized type!");
	}
	properties.return_type = StatementReturnType::NOTHING;
	properties.allow_stream_result = false;
	return result;
}